

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,CompoundStmt *node)

{
  __shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2> *__r;
  long *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  p_Var1 = &((node->stmts).
             super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>;
  for (__r = &((node->stmts).
               super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>; __r != p_Var1;
      __r = __r + 1) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Statement,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_38,__r);
    (**(code **)(*local_38 + 0x10))(local_38,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  return;
}

Assistant:

void operator()(ast::CompoundStmt &node) const override {
    for (auto &stmt : node.stmts)
      visit(stmt);
  }